

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O3

void convert_channels_short_interleaved
               (int buf_c,short *buffer,int data_c,float **data,int d_offset,int len)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  float fVar14;
  float local_b8 [34];
  
  if (((data_c < 7) && (buf_c < 3)) && (buf_c != data_c)) {
    if (0 < buf_c) {
      iVar3 = 0;
      do {
        if (0 < len) {
          iVar13 = 0x10;
          iVar8 = 0;
          iVar11 = 0;
          uVar4 = 0;
          lVar10 = (long)d_offset << 2;
          do {
            iVar6 = iVar13 + (int)uVar4;
            iVar2 = len - (int)uVar4;
            if (iVar6 <= len) {
              iVar2 = iVar13;
            }
            iVar13 = iVar2;
            local_b8[0x1c] = 0.0;
            local_b8[0x1d] = 0.0;
            local_b8[0x1e] = 0.0;
            local_b8[0x1f] = 0.0;
            local_b8[0x18] = 0.0;
            local_b8[0x19] = 0.0;
            local_b8[0x1a] = 0.0;
            local_b8[0x1b] = 0.0;
            local_b8[0x14] = 0.0;
            local_b8[0x15] = 0.0;
            local_b8[0x16] = 0.0;
            local_b8[0x17] = 0.0;
            local_b8[0x10] = 0.0;
            local_b8[0x11] = 0.0;
            local_b8[0x12] = 0.0;
            local_b8[0x13] = 0.0;
            local_b8[0xc] = 0.0;
            local_b8[0xd] = 0.0;
            local_b8[0xe] = 0.0;
            local_b8[0xf] = 0.0;
            local_b8[8] = 0.0;
            local_b8[9] = 0.0;
            local_b8[10] = 0.0;
            local_b8[0xb] = 0.0;
            local_b8[4] = 0.0;
            local_b8[5] = 0.0;
            local_b8[6] = 0.0;
            local_b8[7] = 0.0;
            local_b8[0] = 0.0;
            local_b8[1] = 0.0;
            local_b8[2] = 0.0;
            local_b8[3] = 0.0;
            if (0 < data_c) {
              iVar2 = iVar6;
              if (len < iVar6) {
                iVar2 = len;
              }
              lVar7 = (long)(iVar2 + iVar11);
              uVar5 = 0;
              switch(channel_position[data_c][0] & 6) {
              case 2:
                goto switchD_00161710_caseD_2;
              case 4:
                goto switchD_00161710_caseD_4;
              case 6:
                goto switchD_00161710_caseD_6;
              }
              while (uVar5 = uVar5 + 1, uVar5 != (uint)data_c) {
                switch(channel_position[data_c][uVar5] & 6) {
                case 2:
switchD_00161710_caseD_2:
                  if (0 < iVar13) {
                    pfVar1 = data[uVar5];
                    lVar12 = 0;
                    do {
                      local_b8[lVar12 * 2] =
                           *(float *)((long)pfVar1 + lVar12 * 4 + lVar10) + local_b8[lVar12 * 2];
                      lVar12 = lVar12 + 1;
                    } while (lVar7 != lVar12);
                  }
                  break;
                case 4:
switchD_00161710_caseD_4:
                  if (0 < iVar13) {
                    pfVar1 = data[uVar5];
                    lVar12 = 0;
                    do {
                      local_b8[lVar12 * 2 + 1] =
                           *(float *)((long)pfVar1 + lVar12 * 4 + lVar10) + local_b8[lVar12 * 2 + 1]
                      ;
                      lVar12 = lVar12 + 1;
                    } while (lVar7 != lVar12);
                  }
                  break;
                case 6:
switchD_00161710_caseD_6:
                  if (0 < iVar13) {
                    pfVar1 = data[uVar5];
                    lVar12 = 0;
                    do {
                      fVar14 = *(float *)((long)pfVar1 + lVar12 * 4 + lVar10);
                      *(ulong *)(local_b8 + lVar12 * 2) =
                           CONCAT44(fVar14 + (float)((ulong)*(undefined8 *)(local_b8 + lVar12 * 2)
                                                    >> 0x20),
                                    fVar14 + (float)*(undefined8 *)(local_b8 + lVar12 * 2));
                      lVar12 = lVar12 + 1;
                    } while (lVar7 != lVar12);
                  }
                }
              }
            }
            if (0 < iVar13 * 2) {
              if (len < iVar6) {
                iVar6 = len;
              }
              uVar5 = 0;
              do {
                fVar14 = local_b8[uVar5] + 384.0;
                if ((int)fVar14 < 0x43bf8001) {
                  fVar14 = 383.0;
                }
                if (0x43c07ffe < (int)fVar14) {
                  fVar14 = 384.99997;
                }
                buffer[(long)iVar8 + uVar5] = SUB42(fVar14,0);
                uVar5 = uVar5 + 1;
              } while ((uint)((iVar6 + iVar11) * 2) != uVar5);
            }
            uVar4 = uVar4 + 0x10;
            iVar11 = iVar11 + -0x10;
            lVar10 = lVar10 + 0x40;
            iVar8 = iVar8 + 0x20;
          } while (uVar4 < (uint)len);
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 != buf_c);
    }
  }
  else {
    if (buf_c < data_c) {
      data_c = buf_c;
    }
    if (0 < len) {
      uVar4 = 0;
      do {
        if (data_c < 1) {
          uVar9 = 0;
        }
        else {
          lVar10 = 0;
          do {
            fVar14 = *(float *)(*(long *)((long)data + lVar10 * 4) + uVar4 * 4 + (long)d_offset * 4)
                     + 384.0;
            if ((int)fVar14 < 0x43bf8001) {
              fVar14 = 383.0;
            }
            if (0x43c07ffe < (int)fVar14) {
              fVar14 = 384.99997;
            }
            *(short *)((long)buffer + lVar10) = SUB42(fVar14,0);
            lVar10 = lVar10 + 2;
          } while ((ulong)(uint)data_c * 2 != lVar10);
          buffer = (short *)((long)buffer + lVar10);
          uVar9 = data_c;
        }
        if ((int)uVar9 < buf_c) {
          memset(buffer,0,(ulong)(~uVar9 + buf_c) * 2 + 2);
          buffer = buffer + (ulong)(~uVar9 + buf_c) + 1;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != (uint)len);
    }
  }
  return;
}

Assistant:

static void convert_channels_short_interleaved(int buf_c, short *buffer, int data_c, float **data, int d_offset, int len)
{
   int i;
   check_endianness();
   if (buf_c != data_c && buf_c <= 2 && data_c <= 6) {
      assert(buf_c == 2);
      for (i=0; i < buf_c; ++i)
         compute_stereo_samples(buffer, data_c, data, d_offset, len);
   } else {
      int limit = buf_c < data_c ? buf_c : data_c;
      int j;
      for (j=0; j < len; ++j) {
         for (i=0; i < limit; ++i) {
            FASTDEF(temp);
            float f = data[i][d_offset+j];
            int v = FAST_SCALED_FLOAT_TO_INT(temp, f,15);//data[i][d_offset+j],15);
            if ((unsigned int) (v + 32768) > 65535)
               v = v < 0 ? -32768 : 32767;
            *buffer++ = v;
         }
         for (   ; i < buf_c; ++i)
            *buffer++ = 0;
      }
   }
}